

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int extraout_EDX;
  char *unaff_R14;
  char *damagebinFileName;
  char *unaff_R15;
  sigaction sa;
  char *local_d0;
  sigaction local_c8;
  
  progname = *argv;
  do {
    while( true ) {
      while (damagebinFileName = unaff_R14, iVar1 = getopt(argc,argv,":d:f:s:vh"),
            unaff_R14 = damagebinFileName, iVar1 < 100) {
        if (iVar1 != 0x3a) {
          if (iVar1 == -1) {
            memset(&local_c8,0,0x98);
            sigemptyset(&local_c8.sa_mask);
            local_c8.__sigaction_handler.sa_handler = segfault_sigaction;
            local_c8.sa_flags = 4;
            sigaction(0xb,&local_c8,(sigaction *)0x0);
            crossvalidation::doit(damagebinFileName,unaff_R15,local_d0);
            return 0;
          }
          goto LAB_00101baf;
        }
        main_cold_2();
      }
      if (iVar1 < 0x73) break;
      if (iVar1 != 0x73) {
        if (iVar1 == 0x76) {
          main_cold_1();
        }
        goto LAB_00101baf;
      }
      local_d0 = _optarg;
    }
    unaff_R14 = _optarg;
  } while ((iVar1 == 100) || (unaff_R14 = damagebinFileName, unaff_R15 = _optarg, iVar1 == 0x66));
LAB_00101baf:
  main_cold_4();
  if (extraout_EDX == 1) {
    main_cold_3();
  }
  _Unwind_Resume();
}

Assistant:

int main(int argc, char *argv[]) {

  progname = argv[0];
  char *damagebinFileName;
  char *footprintFileName;
  char *vulnerabilityFileName;
  int opt;
  while((opt = getopt(argc, argv, ":d:f:s:vh")) != -1) {
    switch(opt) {
      case 'd':
	damagebinFileName = optarg;
	break;
      case 'f':
	footprintFileName = optarg;
	break;
      case 's':
	vulnerabilityFileName = optarg;
	break;
      case ':':
	fprintf(stderr, "option needs a value\n");
	break;
      case 'v':
	fprintf(stderr, "%s: version: %s\n", argv[0], VERSION);
	exit(EXIT_FAILURE);
	break;
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);
    }
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {
    crossvalidation::doit(damagebinFileName, footprintFileName,
		    	vulnerabilityFileName);
    return 0;
  }
  catch(std::bad_alloc&) {
    fprintf(stderr, "%s: Memory allocation failed.\n", progname);
    exit(0);
  }

}